

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O3

shared_ptr<hrgls_StreamProperties_> __thiscall
hrgls::StreamProperties::GetRawProperties(StreamProperties *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  shared_ptr<hrgls_StreamProperties_> sVar4;
  shared_ptr<hrgls_StreamProperties_> sVar5;
  shared_ptr<hrgls_StreamProperties_> sVar6;
  
  peVar1 = (this->m_private).
           super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    *(undefined8 *)in_RDI = 0;
    *(undefined8 *)(in_RDI + 8) = 0;
    sVar5.super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = in_RDX._M_pi;
    sVar5.super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (shared_ptr<hrgls_StreamProperties_>)
           sVar5.super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>;
  }
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (peVar1->m_state).
                super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)in_RDI = _Var3._M_pi;
  p_Var2 = (peVar1->m_state).super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RDI + 8) = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      sVar4.super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar4.super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (shared_ptr<hrgls_StreamProperties_>)
             sVar4.super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    UNLOCK();
  }
  sVar6.super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar6.super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<hrgls_StreamProperties_>)
         sVar6.super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<hrgls_StreamProperties_> StreamProperties::GetRawProperties() const
  {
    if (!m_private) {
      return nullptr;
    }
    return m_private->m_state;
  }